

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

TCGReg tcg_reg_alloc(TCGContext_conflict9 *s,TCGRegSet required_regs,TCGRegSet allocated_regs,
                    TCGRegSet preferred_regs,_Bool rev)

{
  byte bVar1;
  intptr_t offset;
  byte *pbVar2;
  tcg_insn_unit *ptVar3;
  byte bVar4;
  TCGReg extraout_EAX;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  TCGRegSet allocated_regs_00;
  int iVar8;
  uint r;
  TCGReg TVar9;
  ulong uVar10;
  uint uVar11;
  int opc;
  int iVar12;
  ulong uVar13;
  TCGTemp *pTVar14;
  TCGTemp *pTVar15;
  TCGContext_conflict9 *s_00;
  uint uVar16;
  undefined7 in_register_00000081;
  long lVar17;
  bool bVar18;
  TCGRegSet reg_ct [2];
  uint local_10 [2];
  
  local_10[1] = ~allocated_regs & required_regs;
  local_10[0] = preferred_regs & local_10[1];
  if ((int)CONCAT71(in_register_00000081,rev) == 0) {
    piVar5 = tcg_target_reg_alloc_order;
  }
  else {
    piVar5 = s->indirect_reg_alloc_order;
  }
  uVar7 = (ulong)(local_10[0] == 0 || local_10[0] == local_10[1]);
  uVar13 = uVar7;
  do {
    uVar11 = local_10[uVar13];
    uVar16 = uVar11 - 1;
    if ((uVar11 & uVar16) == 0) {
      if (uVar11 == 0) {
        uVar10 = 0x20;
      }
      else {
        uVar6 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar10 = (ulong)uVar6;
      }
      if (s->reg_to_temp[uVar10] == (TCGTemp *)0x0) {
        return (TCGReg)uVar10;
      }
    }
    else {
      lVar17 = 0;
      do {
        TVar9 = piVar5[lVar17];
        if ((s->reg_to_temp[TVar9] == (TCGTemp *)0x0) &&
           ((uVar11 >> (TVar9 & TCG_REG_XMM15) & 1) != 0)) {
          return TVar9;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x1f);
      uVar16 = 0x1f;
    }
    bVar18 = uVar13 == 0;
    uVar13 = 1;
  } while (bVar18);
  do {
    uVar11 = local_10[uVar7];
    pTVar14 = (TCGTemp *)(ulong)uVar11;
    if ((uVar11 & uVar11 - 1) == 0) {
      if (uVar11 == 0) {
        uVar13 = 0x20;
      }
      else {
        uVar16 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        uVar13 = (ulong)uVar16;
      }
      TVar9 = (TCGReg)uVar13;
      pTVar14 = s->reg_to_temp[uVar13];
LAB_00d057fb:
      if (pTVar14 != (TCGTemp *)0x0) {
        temp_sync(s,pTVar14,allocated_regs,0,-1);
      }
      return TVar9;
    }
    lVar17 = 0;
    do {
      TVar9 = piVar5[lVar17];
      if ((uVar11 >> (TVar9 & TCG_REG_XMM15) & 1) != 0) {
        pTVar14 = s->reg_to_temp[TVar9];
        goto LAB_00d057fb;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x1f);
    bVar18 = uVar7 == 0;
    uVar7 = 1;
  } while (bVar18);
  tcg_reg_alloc_cold_1();
  uVar13 = *(ulong *)pTVar14;
  if ((uVar13 >> 0x20 & 1) != 0) goto LAB_00d05984;
  iVar12 = (int)lVar17;
  if ((uVar13 >> 0x23 & 1) == 0) {
    pTVar15 = pTVar14;
    s_00 = s;
    if ((uVar13 >> 0x24 & 1) == 0) {
      temp_allocate_frame(s,pTVar14);
      uVar13 = *(ulong *)pTVar14;
    }
    uVar11 = (uint)pTVar15;
    if ((char)(uVar13 >> 8) == '\x01') {
LAB_00d058f1:
      tcg_out_st(s,(TCGType_conflict)(uVar13 >> 0x18) & 0xff,(TCGReg)uVar13 & 0xff,
                 (uint)*(byte *)pTVar14->mem_base,pTVar14->mem_offset);
    }
    else {
      uVar6 = (uint)(uVar13 >> 8) & 0xff;
      if (uVar6 != 2) {
        if (uVar6 != 3) {
          temp_sync_cold_1();
          if (4 < uVar11) {
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
                       ,0x459,(char *)0x0);
          }
          switch(uVar11) {
          case 0:
            uVar13 = 0;
            if (0 < (int)uVar6) {
              uVar13 = (ulong)uVar6;
            }
            uVar11 = (uint)uVar13;
            if (r < 0x10) {
              uVar16 = (uint)(uVar13 >> 3) & 1 | r >> 1 & 4;
              if (uVar16 != 0) {
                pbVar2 = s_00->code_ptr;
                s_00->code_ptr = pbVar2 + 1;
                *pbVar2 = (byte)uVar16 | 0x40;
              }
LAB_00d05a9b:
              ptVar3 = s_00->code_ptr;
              s_00->code_ptr = ptVar3 + 1;
              *ptVar3 = 0x8b;
              goto LAB_00d05aea;
            }
            iVar12 = 0x56e;
            break;
          case 1:
            if (r < 0x10) {
              uVar16 = 0;
              if (0 < (int)uVar6) {
                uVar16 = uVar6;
              }
              pbVar2 = s_00->code_ptr;
              s_00->code_ptr = pbVar2 + 1;
              *pbVar2 = (byte)(uVar16 >> 3) & 1 | (byte)(r >> 1) & 4 | 0x48;
              goto LAB_00d05a9b;
            }
          case 2:
            uVar11 = 0;
            if (0 < (int)uVar6) {
              uVar11 = uVar6;
            }
            iVar12 = 0x2017e;
            break;
          case 3:
            uVar11 = 0;
            if (0 < (int)uVar6) {
              uVar11 = uVar6;
            }
            iVar12 = 0x56f;
            break;
          case 4:
            uVar11 = 0;
            if (0 < (int)uVar6) {
              uVar11 = uVar6;
            }
            iVar12 = 0xa016f;
          }
          tcg_out_vex_opc(s_00,iVar12,r,0,uVar11,uVar16);
LAB_00d05aea:
          tcg_out_sib_offset(s_00,r,uVar6,-1,0,lVar17);
          return extraout_EAX;
        }
        bVar4 = (byte)(uVar13 >> 0x18);
        if (iVar12 == 0) {
LAB_00d058d2:
          temp_load(s,pTVar14,s->tcg_target_available_regs[bVar4],allocated_regs_00,(TCGRegSet)uVar7
                   );
          uVar13 = *(ulong *)pTVar14;
          goto LAB_00d058f1;
        }
        bVar1 = *(byte *)pTVar14->mem_base;
        offset = pTVar14->mem_offset;
        iVar8 = (int)pTVar14->val;
        if (bVar4 == 0) {
          opc = 199;
        }
        else if ((bVar4 != 1) || (opc = 0x10c7, (long)iVar8 != pTVar14->val)) goto LAB_00d058d2;
        tcg_out_opc(s,opc,0,(uint)bVar1,0);
        tcg_out_sib_offset(s,0,(uint)bVar1,-1,0,offset);
        piVar5 = (int *)s->code_ptr;
        *piVar5 = iVar8;
        s->code_ptr = (tcg_insn_unit *)(piVar5 + 1);
      }
    }
    uVar13 = *(ulong *)pTVar14 | 0x800000000;
    *(ulong *)pTVar14 = uVar13;
  }
  if ((uVar13 & 0x100000000) == 0 && iVar12 != 0) {
    if (((uint)uVar13 & 0xff00) == 0x100) {
      s->reg_to_temp[uVar13 & 0xff] = (TCGTemp *)0x0;
      uVar13 = *(ulong *)pTVar14;
    }
    uVar7 = uVar13 >> 0x1c & 0x200;
    if ((uVar13 >> 0x26 & 1) != 0) {
      uVar7 = 0x200;
    }
    if (iVar12 < 0) {
      uVar7 = 0x200;
    }
    uVar13 = uVar13 & 0xffffffffffff00ff | uVar7;
    *(ulong *)pTVar14 = uVar13;
  }
LAB_00d05984:
  return (TCGReg)uVar13;
}

Assistant:

static TCGReg tcg_reg_alloc(TCGContext *s, TCGRegSet required_regs,
                            TCGRegSet allocated_regs,
                            TCGRegSet preferred_regs, bool rev)
{
    int i, j, f, n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    TCGRegSet reg_ct[2];
    const int *order;

    reg_ct[1] = required_regs & ~allocated_regs;
    tcg_debug_assert(reg_ct[1] != 0);
    reg_ct[0] = reg_ct[1] & preferred_regs;

    /* Skip the preferred_regs option if it cannot be satisfied,
       or if the preference made no difference.  */
    f = reg_ct[0] == 0 || reg_ct[0] == reg_ct[1];

    order = rev ? s->indirect_reg_alloc_order : tcg_target_reg_alloc_order;

    /* Try free registers, preferences first.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            if (s->reg_to_temp[reg] == NULL) {
                return reg;
            }
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (s->reg_to_temp[reg] == NULL &&
                    tcg_regset_test_reg(set, reg)) {
                    return reg;
                }
            }
        }
    }

    /* We must spill something.  */
    for (j = f; j < 2; j++) {
        TCGRegSet set = reg_ct[j];

        if (tcg_regset_single(set)) {
            /* One register in the set.  */
            TCGReg reg = tcg_regset_first(set);
            tcg_reg_free(s, reg, allocated_regs);
            return reg;
        } else {
            for (i = 0; i < n; i++) {
                TCGReg reg = order[i];
                if (tcg_regset_test_reg(set, reg)) {
                    tcg_reg_free(s, reg, allocated_regs);
                    return reg;
                }
            }
        }
    }

    tcg_abort();
}